

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# php_generator.cc
# Opt level: O2

string * __thiscall
google::protobuf::compiler::php::(anonymous_namespace)::FirstLineOf_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,string_view value)

{
  ulong uVar1;
  allocator<char> local_21;
  string_view value_local;
  
  value_local._M_str = (char *)value._M_len;
  value_local._M_len = (size_t)this;
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)__return_storage_ptr__,&value_local,&local_21);
  uVar1 = std::__cxx11::string::find((char)__return_storage_ptr__,10);
  if (uVar1 != 0xffffffffffffffff) {
    std::__cxx11::string::erase((ulong)__return_storage_ptr__,uVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

static std::string FirstLineOf(absl::string_view value) {
  std::string result(value);

  std::string::size_type pos = result.find_first_of('\n');
  if (pos != std::string::npos) {
    result.erase(pos);
  }

  return result;
}